

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability-test.c++
# Opt level: O0

Promise<void> __thiscall
capnp::_::anon_unknown_0::TestInterfaceDynamicImpl::call
          (TestInterfaceDynamicImpl *this,Method method,
          CallContext<capnp::DynamicStruct,_capnp::DynamicStruct> context)

{
  Reader reader;
  bool bVar1;
  anon_class_8_1_bc11688f *func;
  long in_RSI;
  undefined8 in_stack_fffffffffffff700;
  Maybe<kj::Exception> *__return_storage_ptr__;
  Fault local_880;
  Fault f;
  undefined1 auStack_870 [7];
  bool _kj_shouldLog_2;
  Maybe<kj::Exception> local_868;
  DebugExpression<kj::Maybe<kj::Exception>_> local_6d0;
  undefined1 local_538 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_2;
  Reader local_370;
  ReaderFor<capnp::DynamicStruct> local_328;
  undefined1 local_2f0 [8];
  Reader params_1;
  Reader local_2a8;
  ArrayPtr<const_char> local_260;
  Maybe<capnp::MessageSize> local_248;
  Builder local_230;
  bool local_1f9;
  undefined1 auStack_1f8 [7];
  bool _kj_shouldLog_1;
  Reader local_1e8;
  bool local_19a;
  DebugExpression<bool> local_199;
  undefined1 auStack_198 [7];
  DebugExpression<bool> _kjCondition_1;
  Reader local_188;
  ReaderFor<int> local_140;
  int local_13c;
  bool local_135;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_128;
  Reader local_118;
  ReaderFor<int> local_cc;
  int local_c8;
  DebugExpression<int> local_c4;
  undefined1 local_c0 [8];
  DebugComparison<int,_int> _kjCondition;
  Reader params;
  Reader local_58;
  undefined1 local_28 [8];
  Reader methodName;
  TestInterfaceDynamicImpl *this_local;
  
  InterfaceSchema::Method::getProto(&local_58,&method);
  _local_28 = (ArrayPtr<const_char>)capnp::schema::Method::Reader::getName(&local_58);
  kj::StringPtr::StringPtr((StringPtr *)&params.reader.nestingLimit,"foo");
  bVar1 = kj::StringPtr::operator==((StringPtr *)local_28,(StringPtr *)&params.reader.nestingLimit);
  if (bVar1) {
    **(int **)(in_RSI + 0x20) = **(int **)(in_RSI + 0x20) + 1;
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams
              ((Reader *)&_kjCondition.result,&context);
    local_c8 = 0x7b;
    local_c4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_c8);
    kj::StringPtr::StringPtr((StringPtr *)&local_128,"i");
    DynamicStruct::Reader::get(&local_118,(Reader *)&_kjCondition.result,(StringPtr)local_128);
    local_cc = DynamicValue::Reader::as<int>(&local_118);
    kj::_::DebugExpression<int>::operator==
              ((DebugComparison<int,_int> *)local_c0,&local_c4,&local_cc);
    DynamicValue::Reader::~Reader(&local_118);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
    if (!bVar1) {
      local_135 = kj::_::Debug::shouldLog(ERROR);
      while (local_135 != false) {
        local_13c = 0x7b;
        kj::StringPtr::StringPtr((StringPtr *)auStack_198,"i");
        DynamicStruct::Reader::get
                  (&local_188,(Reader *)&_kjCondition.result,(StringPtr)_auStack_198);
        local_140 = DynamicValue::Reader::as<int>(&local_188);
        kj::_::Debug::log<char_const(&)[54],kj::_::DebugComparison<int,int>&,int,int>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x1f5,ERROR,
                   "\"failed: expected \" \"(123) == (params.get(\\\"i\\\").as<int>())\", _kjCondition, 123, params.get(\"i\").as<int>()"
                   ,(char (*) [54])"failed: expected (123) == (params.get(\"i\").as<int>())",
                   (DebugComparison<int,_int> *)local_c0,&local_13c,&local_140);
        DynamicValue::Reader::~Reader(&local_188);
        local_135 = false;
      }
    }
    kj::StringPtr::StringPtr((StringPtr *)auStack_1f8,"j");
    DynamicStruct::Reader::get(&local_1e8,(Reader *)&_kjCondition.result,(StringPtr)_auStack_1f8);
    local_19a = DynamicValue::Reader::as<bool>(&local_1e8);
    local_199 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_19a);
    DynamicValue::Reader::~Reader(&local_1e8);
    bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_199);
    if (!bVar1) {
      local_1f9 = kj::_::Debug::shouldLog(ERROR);
      while (local_1f9 != false) {
        kj::_::Debug::log<char_const(&)[44],kj::_::DebugExpression<bool>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                   ,0x1f6,ERROR,
                   "\"failed: expected \" \"params.get(\\\"j\\\").as<bool>()\", _kjCondition",
                   (char (*) [44])"failed: expected params.get(\"j\").as<bool>()",&local_199);
        local_1f9 = false;
      }
    }
    kj::Maybe<capnp::MessageSize>::Maybe();
    CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getResults
              (&local_230,&context,&local_248);
    kj::StringPtr::StringPtr((StringPtr *)&local_260,"x");
    DynamicValue::Reader::Reader(&local_2a8,"foo");
    DynamicStruct::Builder::set(&local_230,(StringPtr)local_260,&local_2a8);
    DynamicValue::Reader::~Reader(&local_2a8);
    kj::Maybe<capnp::MessageSize>::~Maybe(&local_248);
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  }
  else {
    kj::StringPtr::StringPtr((StringPtr *)&params_1.reader.nestingLimit,"baz");
    bVar1 = kj::StringPtr::operator==
                      ((StringPtr *)local_28,(StringPtr *)&params_1.reader.nestingLimit);
    if (bVar1) {
      **(int **)(in_RSI + 0x20) = **(int **)(in_RSI + 0x20) + 1;
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::getParams
                ((Reader *)local_2f0,&context);
      kj::StringPtr::StringPtr((StringPtr *)&_kjCondition_2.result,"s");
      DynamicStruct::Reader::get(&local_370,(Reader *)local_2f0,(StringPtr)stack0xfffffffffffffc80);
      DynamicValue::Reader::as<capnp::DynamicStruct>(&local_328,&local_370);
      reader.reader.segment = (SegmentReader *)local_328.reader.capTable;
      reader.schema.super_Schema.raw = (Schema)(Schema)local_328.reader.segment;
      reader.reader.capTable = (CapTableReader *)local_328.reader.data;
      reader.reader.data = local_328.reader.pointers;
      reader.reader.pointers = (WirePointer *)local_328.reader._32_8_;
      reader.reader.dataSize = local_328.reader.nestingLimit;
      reader.reader.pointerCount = local_328.reader._44_2_;
      reader.reader._38_2_ = local_328.reader._46_2_;
      reader.reader._40_8_ = in_stack_fffffffffffff700;
      checkDynamicTestMessage(reader);
      DynamicValue::Reader::~Reader(&local_370);
      CallContext<capnp::DynamicStruct,_capnp::DynamicStruct>::releaseParams(&context);
      __return_storage_ptr__ = &local_868;
      _auStack_870 = &context;
      kj::
      runCatchingExceptions<capnp::_::(anonymous_namespace)::TestInterfaceDynamicImpl::call(capnp::InterfaceSchema::Method,capnp::CallContext<capnp::DynamicStruct,capnp::DynamicStruct>)::_lambda()_1_>
                (__return_storage_ptr__,(kj *)auStack_870,func);
      kj::_::DebugExpressionStart::operator<<
                (&local_6d0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,__return_storage_ptr__);
      kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
                ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_538,
                 (DebugExpression<kj::Maybe<kj::Exception>> *)&local_6d0,(None *)&kj::none);
      kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_6d0);
      kj::Maybe<kj::Exception>::~Maybe(&local_868);
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_538);
      if (!bVar1) {
        f.exception._7_1_ = kj::_::Debug::shouldLog(ERROR);
        while ((bool)f.exception._7_1_ != false) {
          kj::_::Debug::
          log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                    ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                     ,0x1fe,ERROR,
                     "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none\", _kjCondition"
                     ,(char (*) [89])
                      "failed: expected ::kj::runCatchingExceptions([&]() { context.getParams(); }) != kj::none"
                     ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_538);
          f.exception._7_1_ = false;
        }
      }
      kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
                ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_538);
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23],capnp::Text::Reader&>
                (&local_880,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability-test.c++"
                 ,0x201,UNIMPLEMENTED,(char *)0x0,"\"Method not implemented\", methodName",
                 (char (*) [23])"Method not implemented",(Reader *)local_28);
      kj::_::Debug::Fault::~Fault(&local_880);
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> call(InterfaceSchema::Method method,
                         CallContext<DynamicStruct, DynamicStruct> context) override {
    auto methodName = method.getProto().getName();
    if (methodName == "foo") {
      ++callCount;
      auto params = context.getParams();
      EXPECT_EQ(123, params.get("i").as<int>());
      EXPECT_TRUE(params.get("j").as<bool>());
      context.getResults().set("x", "foo");
      return kj::READY_NOW;
    } else if (methodName == "baz") {
      ++callCount;
      auto params = context.getParams();
      checkDynamicTestMessage(params.get("s").as<DynamicStruct>());
      context.releaseParams();
      EXPECT_ANY_THROW(context.getParams());
      return kj::READY_NOW;
    } else {
      KJ_UNIMPLEMENTED("Method not implemented", methodName) { break; }
      return kj::READY_NOW;
    }
  }